

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O0

JavascriptString * __thiscall Js::CharStringCache::GetStringForCharA(CharStringCache *this,char c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyString **ppPVar4;
  JavascriptLibrary *this_00;
  ScriptContext *this_01;
  JavascriptLibrary *javascriptLibrary;
  PropertyRecord *pPStack_28;
  char16 wc;
  PropertyRecord *propertyRecord;
  PropertyString *str;
  CharStringCache *pCStack_10;
  char c_local;
  CharStringCache *this_local;
  
  str._7_1_ = c;
  pCStack_10 = this;
  bVar2 = JavascriptString::IsASCII7BitChar((short)c);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x13,"(JavascriptString::IsASCII7BitChar(c))",
                                "GetStringForCharA must be called with ASCII 7bit chars only");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppPVar4 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                      ((WriteBarrierPtr *)(this->charStringCacheA + (int)str._7_1_));
  propertyRecord = (PropertyRecord *)*ppPVar4;
  if ((PropertyString *)propertyRecord == (PropertyString *)0x0) {
    javascriptLibrary._6_2_ = (short)str._7_1_;
    this_00 = JavascriptLibrary::FromCharStringCache(this);
    this_01 = JavascriptLibrary::GetScriptContext(this_00);
    ScriptContext::GetOrAddPropertyRecord
              (this_01,(LPCWSTR)((long)&javascriptLibrary + 6),1,&stack0xffffffffffffffd8);
    propertyRecord = (PropertyRecord *)JavascriptLibrary::CreatePropertyString(this_00,pPStack_28);
    Memory::WriteBarrierPtr<Js::PropertyString>::operator=
              (this->charStringCacheA + (int)str._7_1_,(PropertyString *)propertyRecord);
  }
  return (JavascriptString *)propertyRecord;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharA(char c)
    {
        AssertMsg(JavascriptString::IsASCII7BitChar(c), "GetStringForCharA must be called with ASCII 7bit chars only");

        PropertyString * str = charStringCacheA[(int)c];
        if (str == nullptr)
        {
            PropertyRecord const * propertyRecord;
            char16 wc = c;
            JavascriptLibrary * javascriptLibrary = JavascriptLibrary::FromCharStringCache(this);
            javascriptLibrary->GetScriptContext()->GetOrAddPropertyRecord(&wc, 1, &propertyRecord);
            str = javascriptLibrary->CreatePropertyString(propertyRecord);
            charStringCacheA[(int)c] = str;
        }

        return str;
    }